

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

int __thiscall
CTcSymLocalBase::apply_ctx_var_conv
          (CTcSymLocalBase *this,CTcPrsSymtab *symtab,CTPNCodeBody *code_body)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = *(ushort *)&this->field_0x64;
  if ((uVar1 >> 8 & 1) == 0) {
    (*symtab->_vptr_CTcPrsSymtab[4])(symtab,this);
  }
  else if (&this->ctx_orig_->super_CTcSymLocalBase != (CTcSymLocalBase *)0x0) {
    convert_to_ctx_var(&this->ctx_orig_->super_CTcSymLocalBase,uVar1 >> 6 & 1,uVar1 >> 7 & 1);
    iVar2 = CTPNCodeBodyBase::get_or_add_ctx_var_for_level
                      (&code_body->super_CTPNCodeBodyBase,this->ctx_level_);
    this->ctx_var_num_ = iVar2;
    this->field_0x64 = this->field_0x64 | 0x20;
    return 1;
  }
  return 0;
}

Assistant:

int CTcSymLocalBase::apply_ctx_var_conv(
    CTcPrsSymtab *symtab, CTPNCodeBody *code_body)
{
    /* 
     *   if this symbol isn't referenced, simply delete it from the table,
     *   so that it doesn't get entered in the debug records; and there's
     *   no need to propagate it back to the enclosing scope as a context
     *   variable, since it's not referenced from this enclosed scope 
     */
    if (!referenced_)
    {
        /* remove the symbol from the table */
        symtab->remove_entry(this);

        /* this variable doesn't need to be converted */
        return FALSE;
    }

    /* 
     *   convert the symbol in the enclosing scope to a context local, if
     *   it's not already 
     */
    if (ctx_orig_ != 0)
    {
        /* convert the original to a context symbol */
        ctx_orig_->convert_to_ctx_var(get_val_used(), get_val_assigned());

        /* 
         *   ask the code body for the context object's local variable for
         *   our recursion level 
         */
        ctx_var_num_ = code_body->get_or_add_ctx_var_for_level(ctx_level_);

        /* note that we've set our context variable ID */
        ctx_var_num_set_ = TRUE;

        /* this variable was converted */
        return TRUE;
    }

    /* this variable wasn't converted */
    return FALSE;
}